

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O1

void sysbvm_dwarf_debugInfo_line_setAddress
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t value)

{
  sysbvm_dynarray_t *dynarray;
  size_t sVar1;
  uint32_t addressOffset;
  undefined1 local_2f;
  undefined1 local_2e;
  undefined1 local_2d;
  undefined4 local_2c;
  uintptr_t local_28;
  
  dynarray = &builder->line;
  local_2f = 0;
  sysbvm_dynarray_addAll(dynarray,1,&local_2f);
  local_2e = 9;
  sysbvm_dynarray_add(dynarray,&local_2e);
  local_2d = 2;
  sysbvm_dynarray_addAll(dynarray,1,&local_2d);
  sVar1 = (builder->line).size;
  local_28 = value;
  sysbvm_dynarray_addAll(dynarray,8,&local_28);
  local_2c = (int)sVar1;
  sysbvm_dynarray_add(&builder->lineTextAddresses,&local_2c);
  (builder->lineProgramState).regAddress = (uint32_t)value;
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_line_setAddress(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t value)
{
    sysbvm_dwarf_encodeByte(&builder->line, 0);
    sysbvm_dwarf_encodeULEB128(&builder->line, 1 + sizeof(value));
    sysbvm_dwarf_encodeByte(&builder->line, DW_LNE_set_address);
    uint32_t addressOffset = (uint32_t)sysbvm_dwarf_encodePointer(&builder->line, value);
    sysbvm_dynarray_add(&builder->lineTextAddresses, &addressOffset);
    builder->lineProgramState.regAddress = (uint32_t)value;
}